

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkEwtSetSV(N_Vector ycur,N_Vector weight,void *arkode_mem)

{
  double dVar1;
  
  N_VAbs(ycur,*(undefined8 *)((long)arkode_mem + 0x248));
  N_VLinearSum(*(undefined8 *)((long)arkode_mem + 0x20),*(undefined8 *)((long)arkode_mem + 0x248),
               *(undefined8 *)((long)arkode_mem + 0x30),*(undefined8 *)((long)arkode_mem + 0x248));
  if ((*(int *)((long)arkode_mem + 0x38) != 0) &&
     (dVar1 = (double)N_VMin(*(undefined8 *)((long)arkode_mem + 0x248)), dVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(*(undefined8 *)((long)arkode_mem + 0x248),weight);
  return 0;
}

Assistant:

int arkEwtSetSV(N_Vector ycur, N_Vector weight, void* arkode_mem)
{
  ARKodeMem ark_mem = (ARKodeMem)arkode_mem;
  N_VAbs(ycur, ark_mem->tempv1);
  N_VLinearSum(ark_mem->reltol, ark_mem->tempv1, ONE, ark_mem->Vabstol,
               ark_mem->tempv1);
  if (ark_mem->atolmin0)
  {
    if (N_VMin(ark_mem->tempv1) <= ZERO) { return (-1); }
  }
  N_VInv(ark_mem->tempv1, weight);
  return (0);
}